

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::parse(Reader *this,char *beginDoc,char *endDoc,Value *root)

{
  bool bVar1;
  Token token;
  allocator local_61;
  string local_60;
  Token local_40;
  
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->current_ = beginDoc;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::clear
            (&this->errors_);
  while ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_60._M_dataplus._M_p = (pointer)root;
  std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
            ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_60);
  bVar1 = readValue(this);
  skipCommentTokens(this,&local_40);
  if ((7 < (byte)root->field_0x8) || ((0xc1U >> ((byte)root->field_0x8 & 0x1f) & 1) == 0)) {
    local_40.type_ = tokenError;
    local_40.start_ = beginDoc;
    local_40.end_ = endDoc;
    std::__cxx11::string::string
              ((string *)&local_60,
               "A valid JSON document must be either an array or an object value.",&local_61);
    addError(this,&local_60,&local_40,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
Reader::parse ( const char* beginDoc, const char* endDoc,
                Value& root)
{
    begin_ = beginDoc;
    end_ = endDoc;
    current_ = begin_;
    lastValueEnd_ = 0;
    lastValue_ = 0;
    errors_.clear ();

    while ( !nodes_.empty () )
        nodes_.pop ();

    nodes_.push ( &root );

    bool successful = readValue ();
    Token token;
    skipCommentTokens ( token );

    if ( !root.isArray ()  &&  !root.isObject () )
    {
        // Set error location to start of doc, ideally should be first token found in doc
        token.type_ = tokenError;
        token.start_ = beginDoc;
        token.end_ = endDoc;
        addError ( "A valid JSON document must be either an array or an object value.",
                   token );
        return false;
    }

    return successful;
}